

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sight.cpp
# Opt level: O0

bool __thiscall SightCheck::PTR_SightTraverse(SightCheck *this,intercept_t *in)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  line_t_conflict *linedef;
  F3DFloor *pFVar7;
  F3DFloor *pFVar8;
  bool bVar9;
  uint uVar10;
  xfloor *pxVar11;
  F3DFloor **ppFVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  sector_t_conflict *local_1b0;
  sector_t_conflict *local_1a8;
  sector_t_conflict *local_1a0;
  double ffb_top;
  double ffb_bottom;
  F3DFloor *rover2;
  iterator __end6;
  iterator __begin6;
  TDeletingArray<F3DFloor_*,_F3DFloor_*> *__range6;
  sector_t_conflict *sb;
  double ff_top;
  double ff_bottom;
  F3DFloor *rover;
  iterator __end3;
  iterator __begin3;
  TDeletingArray<F3DFloor_*,_F3DFloor_*> *__range3;
  double bottomz;
  double topz;
  double lowslope;
  double highslope;
  sector_t_conflict *s;
  undefined1 local_f8 [4];
  int i;
  SightTask local_e8;
  SightTask local_c8;
  SightTask local_a8;
  TVector2<double> local_88;
  sector_t_conflict *local_78;
  sector_t_conflict *backsec;
  sector_t_conflict *frontsec;
  FLinePortal *lport;
  double trY;
  double trX;
  undefined1 auStack_48 [4];
  int frontflag;
  SightOpening open;
  double slope;
  line_t_conflict *li;
  intercept_t *in_local;
  SightCheck *this_local;
  
  trX._4_4_ = -1;
  linedef = (in->d).line;
  if (((i_compatflags & 0x2000U) == 0) || (linedef->frontsector != linedef->backsector)) {
    trY = (this->Trace).x + (this->Trace).dx * in->frac;
    lport = (FLinePortal *)((this->Trace).y + (this->Trace).dy * in->frac);
    P_SightOpening(this,(SightOpening *)auStack_48,linedef,trY,(double)lport);
    frontsec = (sector_t_conflict *)line_t::getPortal((line_t *)linedef);
    if (((open.bottom._0_4_ == 0) && (open.bottom._4_4_ == 0)) &&
       ((frontsec == (sector_t_conflict *)0x0 ||
        (*(BYTE *)&frontsec->planes[0].xform.yScale != '\x03')))) {
      this_local._7_1_ = false;
    }
    else if ((in->frac != 0.0) || (NAN(in->frac))) {
      if ((-3.4028234663852886e+38 < open.top) &&
         (open._16_8_ = (open.top - (this->sightstart).Z) / in->frac,
         this->bottomslope <= (double)open._16_8_ && (double)open._16_8_ != this->bottomslope)) {
        this->bottomslope = (double)open._16_8_;
      }
      if ((_auStack_48 < 3.4028234663852886e+38) &&
         (open._16_8_ = (_auStack_48 - (this->sightstart).Z) / in->frac,
         (double)open._16_8_ < this->topslope)) {
        this->topslope = (double)open._16_8_;
      }
      if (open.bottom._4_4_ != 0) {
        TVector2<double>::TVector2(&local_88,&this->sightstart);
        trX._4_4_ = P_PointOnLineSidePrecise(&local_88,linedef);
        if (trX._4_4_ == 0) {
          backsec = linedef->frontsector;
          local_78 = linedef->backsector;
        }
        else {
          backsec = linedef->backsector;
          if (backsec == (sector_t_conflict *)0x0) {
            return false;
          }
          local_78 = linedef->frontsector;
          SightOpening::SwapSides((SightOpening *)auStack_48);
        }
        if (((this->portaldir != 0) && ((open.bottom._4_4_ & 2) != 0)) &&
           ((open.bottom._4_4_ & 1) == 0)) {
          local_a8.Frac = in->frac;
          local_a8.topslope = this->topslope;
          local_a8.bottomslope = this->bottomslope;
          local_a8.direction = 1;
          local_a8.portalgroup = sector_t::GetOppositePortalGroup((sector_t *)local_78,1);
          TArray<SightTask,_SightTask>::Push(&portals,&local_a8);
        }
        if (((this->portaldir != 1) && ((open.bottom._4_4_ & 8) != 0)) &&
           ((open.bottom._4_4_ & 4) == 0)) {
          local_c8.Frac = in->frac;
          local_c8.topslope = this->topslope;
          local_c8.bottomslope = this->bottomslope;
          local_c8.direction = 0;
          local_c8.portalgroup = sector_t::GetOppositePortalGroup((sector_t *)local_78,0);
          TArray<SightTask,_SightTask>::Push(&portals,&local_c8);
        }
      }
      if (frontsec == (sector_t_conflict *)0x0) {
        if ((this->topslope <= this->bottomslope) || (open.bottom._0_4_ == 0)) {
          this_local._7_1_ = false;
        }
        else {
          uVar10 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                             ((TArray<F3DFloor_*,_F3DFloor_*> *)&linedef->frontsector->e->XFloor);
          if ((uVar10 == 0) &&
             (uVar10 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                                 ((TArray<F3DFloor_*,_F3DFloor_*> *)&linedef->backsector->e->XFloor)
             , uVar10 == 0)) {
            this->lastsector = (sector_t_conflict *)0x0;
          }
          else {
            if (trX._4_4_ == -1) {
              TVector2<double>::TVector2((TVector2<double> *)local_f8,&this->sightstart);
              trX._4_4_ = P_PointOnLineSidePrecise((DVector2 *)local_f8,linedef);
            }
            for (s._4_4_ = 1; s._4_4_ < 3; s._4_4_ = s._4_4_ + 1) {
              if (s._4_4_ == 1) {
                local_1a0 = linedef->frontsector;
              }
              else {
                local_1a0 = linedef->backsector;
              }
              dVar1 = this->topslope;
              dVar2 = in->frac;
              dVar3 = (this->sightstart).Z;
              dVar4 = this->bottomslope;
              dVar5 = in->frac;
              dVar6 = (this->sightstart).Z;
              pxVar11 = &local_1a0->e->XFloor;
              __end3 = TArray<F3DFloor_*,_F3DFloor_*>::begin
                                 ((TArray<F3DFloor_*,_F3DFloor_*> *)pxVar11);
              rover = (F3DFloor *)
                      TArray<F3DFloor_*,_F3DFloor_*>::end((TArray<F3DFloor_*,_F3DFloor_*> *)pxVar11)
              ;
              while (bVar9 = TIterator<F3DFloor_*>::operator!=
                                       (&__end3,(TIterator<F3DFloor_*> *)&rover), bVar9) {
                ppFVar12 = TIterator<F3DFloor_*>::operator*(&__end3);
                pFVar7 = *ppFVar12;
                if ((((pFVar7->flags & 0x2000000) != this->myseethrough) &&
                    ((pFVar7->flags & 1) != 0)) &&
                   (((this->Flags & 8U) == 0 || ((pFVar7->flags & 2) != 0)))) {
                  dVar13 = secplane_t::ZatPoint((pFVar7->bottom).plane,trY,(double)lport);
                  dVar14 = secplane_t::ZatPoint((pFVar7->top).plane,trY,(double)lport);
                  dVar15 = (dVar14 - (this->sightstart).Z) / in->frac;
                  dVar16 = (dVar13 - (this->sightstart).Z) / in->frac;
                  if (dVar15 < this->topslope) {
                    if (this->bottomslope < dVar16) {
                      if (s._4_4_ == 2) {
                        local_1a8 = linedef->frontsector;
                      }
                      else {
                        local_1a8 = linedef->backsector;
                      }
                      pxVar11 = &local_1a8->e->XFloor;
                      __end6 = TArray<F3DFloor_*,_F3DFloor_*>::begin
                                         ((TArray<F3DFloor_*,_F3DFloor_*> *)pxVar11);
                      rover2 = (F3DFloor *)
                               TArray<F3DFloor_*,_F3DFloor_*>::end
                                         ((TArray<F3DFloor_*,_F3DFloor_*> *)pxVar11);
                      while (bVar9 = TIterator<F3DFloor_*>::operator!=
                                               (&__end6,(TIterator<F3DFloor_*> *)&rover2), bVar9) {
                        ppFVar12 = TIterator<F3DFloor_*>::operator*(&__end6);
                        pFVar8 = *ppFVar12;
                        if ((((pFVar8->flags & 0x2000000) != this->myseethrough) &&
                            ((pFVar8->flags & 1) != 0)) &&
                           (((this->Flags & 8U) == 0 || ((pFVar7->flags & 2) != 0)))) {
                          dVar17 = secplane_t::ZatPoint((pFVar8->bottom).plane,trY,(double)lport);
                          dVar18 = secplane_t::ZatPoint((pFVar8->top).plane,trY,(double)lport);
                          if (((dVar13 <= dVar17) && (dVar17 <= dVar14)) ||
                             (((dVar18 <= dVar14 && (dVar13 <= dVar18)) ||
                              (((dVar14 <= dVar18 && (dVar17 <= dVar13)) ||
                               ((dVar18 <= dVar14 && (dVar13 <= dVar17)))))))) {
                            return false;
                          }
                        }
                        TIterator<F3DFloor_*>::operator++(&__end6);
                      }
                    }
                    else if (this->bottomslope <= dVar15 && dVar15 != this->bottomslope) {
                      this->bottomslope = dVar15;
                    }
                  }
                  else {
                    if (dVar16 <= this->bottomslope) {
                      return false;
                    }
                    if (dVar16 < this->topslope) {
                      this->topslope = dVar16;
                    }
                  }
                  if ((local_1a0 == this->lastsector) && (trX._4_4_ == s._4_4_ + -1)) {
                    if ((this->Lastztop <= dVar13) && (dVar14 < dVar1 * dVar2 + dVar3)) {
                      this->topslope = dVar16;
                    }
                    if ((dVar14 <= this->Lastzbottom) && (dVar4 * dVar5 + dVar6 < dVar14)) {
                      this->bottomslope = dVar15;
                    }
                  }
                  if (this->topslope <= this->bottomslope) {
                    return false;
                  }
                }
                TIterator<F3DFloor_*>::operator++(&__end3);
              }
            }
            if (trX._4_4_ == 0) {
              local_1b0 = linedef->backsector;
            }
            else {
              local_1b0 = linedef->frontsector;
            }
            this->lastsector = local_1b0;
          }
          this->Lastztop = this->topslope * in->frac + (this->sightstart).Z;
          this->Lastzbottom = this->bottomslope * in->frac + (this->sightstart).Z;
          this_local._7_1_ = true;
        }
      }
      else {
        local_e8.Frac = in->frac;
        local_e8.topslope = this->topslope;
        local_e8.bottomslope = this->bottomslope;
        local_e8.direction = this->portaldir;
        local_e8.portalgroup =
             *(int *)(*(long *)((long)frontsec->planes[0].xform.yOffs + 0x78) + 0x208);
        TArray<SightTask,_SightTask>::Push(&portals,&local_e8);
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool SightCheck::PTR_SightTraverse (intercept_t *in)
{
	line_t  *li;
	double slope;
	SightOpening open;
	int  frontflag = -1;

	li = in->d.line;

//
// crosses a two sided line
//

	// ignore self referencing sectors if COMPAT_TRACE is on
	if ((i_compatflags & COMPATF_TRACE) && li->frontsector == li->backsector) 
		return true;

	double trX = Trace.x + Trace.dx * in->frac;
	double trY = Trace.y + Trace.dy * in->frac;
	P_SightOpening (open, li, trX, trY);

	FLinePortal *lport = li->getPortal();

	if (open.range == 0 && open.portalflags == 0 && (lport == NULL || lport->mType != PORTT_LINKED))		// quick test for totally closed doors (must be delayed if portal checks are needed, though)
		return false;		// stop

	if (in->frac == 0)
		return true;

	// check bottom
	if (open.bottom > LINEOPEN_MIN)
	{
		slope = (open.bottom - sightstart.Z) / in->frac;
		if (slope > bottomslope)
			bottomslope = slope;
	}

	// check top
	if (open.top < LINEOPEN_MAX)
	{
		slope = (open.top - sightstart.Z) / in->frac;
		if (slope < topslope)
			topslope = slope;
	}

	if (open.portalflags)
	{
		sector_t *frontsec, *backsec;
		frontflag = P_PointOnLineSidePrecise(sightstart, li);
		if (!frontflag)
		{
			frontsec = li->frontsector;
			backsec = li->backsector;
		}
		else
		{
			frontsec = li->backsector;
			if (!frontsec) return false;	// We are looking through the backside of a one-sided line. Just abort if that happens.
			backsec = li->frontsector;
			open.SwapSides();				// swap flags to make the next checks simpler.
		}

		if (portaldir != sector_t::floor && (open.portalflags & SO_TOPBACK) && !(open.portalflags & SO_TOPFRONT))
		{
			portals.Push({ in->frac, topslope, bottomslope, sector_t::ceiling, backsec->GetOppositePortalGroup(sector_t::ceiling) });
		}
		if (portaldir != sector_t::ceiling && (open.portalflags & SO_BOTTOMBACK) && !(open.portalflags & SO_BOTTOMFRONT))
		{
			portals.Push({ in->frac, topslope, bottomslope, sector_t::floor, backsec->GetOppositePortalGroup(sector_t::floor) });
		}
	}
	if (lport)
	{
		portals.Push({ in->frac, topslope, bottomslope, portaldir, lport->mDestination->frontsector->PortalGroup });
		return false;
	}

	if (topslope <= bottomslope || open.range == 0)
		return false;		// stop

	// now handle 3D-floors
	if(li->frontsector->e->XFloor.ffloors.Size() || li->backsector->e->XFloor.ffloors.Size())
	{
		if (frontflag == -1) frontflag = P_PointOnLineSidePrecise(sightstart, li);
		
		//Check 3D FLOORS!
		for(int i=1;i<=2;i++)
		{
			sector_t * s=i==1? li->frontsector:li->backsector;
			double    highslope, lowslope;

			double topz= topslope * in->frac + sightstart.Z;
			double bottomz= bottomslope * in->frac + sightstart.Z;

			for (auto rover : s->e->XFloor.ffloors)
			{
				if ((rover->flags & FF_SEETHROUGH) == myseethrough || !(rover->flags & FF_EXISTS)) continue;
				if ((Flags & SF_IGNOREWATERBOUNDARY) && (rover->flags & FF_SOLID) == 0) continue;

				double ff_bottom = rover->bottom.plane->ZatPoint(trX, trY);
				double ff_top = rover->top.plane->ZatPoint(trX, trY);

				highslope = (ff_top - sightstart.Z) / in->frac;
				lowslope = (ff_bottom - sightstart.Z) / in->frac;

				if (highslope >= topslope)
				{
					// blocks completely
					if (lowslope <= bottomslope) return false;
					// blocks upper edge of view
					if (lowslope < topslope) topslope = lowslope;
				}
				else if (lowslope <= bottomslope)
				{
					// blocks lower edge of view
					if (highslope > bottomslope)  bottomslope = highslope;
				}
				else
				{
					// the 3D-floor is inside the viewing cone but neither clips the top nor the bottom so by 
					// itself it can't be view blocking.
					// However, if there's a 3D-floor on the other side that obstructs the same vertical range
					// the 2 together will block sight.
					sector_t * sb = i == 2 ? li->frontsector : li->backsector;

					for (auto rover2 : sb->e->XFloor.ffloors)
					{
						if ((rover2->flags & FF_SEETHROUGH) == myseethrough || !(rover2->flags & FF_EXISTS)) continue;
						if ((Flags & SF_IGNOREWATERBOUNDARY) && (rover->flags & FF_SOLID) == 0) continue;

						double ffb_bottom = rover2->bottom.plane->ZatPoint(trX, trY);
						double ffb_top = rover2->top.plane->ZatPoint(trX, trY);

						if ((ffb_bottom >= ff_bottom && ffb_bottom <= ff_top) ||
							(ffb_top <= ff_top && ffb_top >= ff_bottom) ||
							(ffb_top >= ff_top && ffb_bottom <= ff_bottom) ||
							(ffb_top <= ff_top && ffb_bottom >= ff_bottom))
						{
							return false;
						}
					}
				}
				// trace is leaving a sector with a 3d-floor
				if (s == lastsector && frontflag == i - 1)
				{
					// upper slope intersects with this 3d-floor
					if (Lastztop <= ff_bottom && topz > ff_top)
					{
						topslope = lowslope;
					}
					// lower slope intersects with this 3d-floor
					if (Lastzbottom >= ff_top && bottomz < ff_top)
					{
						bottomslope = highslope;
					}
				}
				if (topslope <= bottomslope) return false;		// stop
			}
		}
		lastsector = frontflag==0 ? li->backsector : li->frontsector;
	}
	else lastsector=NULL;	// don't need it if there are no 3D-floors

	Lastztop = (topslope * in->frac) + sightstart.Z;
	Lastzbottom = (bottomslope * in->frac) + sightstart.Z;

	return true;			// keep going
}